

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

void __thiscall
chaiscript::exception::load_module_error::load_module_error
          (load_module_error *this,string *t_name,
          vector<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
          *t_errors)

{
  string local_30;
  
  format_error(&local_30,t_name,t_errors);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)this = &PTR__runtime_error_00460480;
  return;
}

Assistant:

load_module_error(const std::string &t_name, const std::vector<load_module_error> &t_errors)
          : std::runtime_error(format_error(t_name, t_errors)) {
      }